

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O2

void curses_interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  ulong uVar1;
  double vol;
  undefined4 uVar2;
  _win_st *p_Var3;
  WINDOW_u WVar4;
  _func_void_void_ptr *p_Var5;
  void *pvVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  File_Selection_Code FVar12;
  Player_Type value;
  char *pcVar13;
  Player *pPVar14;
  string *psVar15;
  undefined8 uVar16;
  Midi_Program_Ex *pMVar17;
  WINDOW *pWVar18;
  pointer p_Var19;
  uint timeout;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint timeout_00;
  uint timeout_01;
  Program *pPVar20;
  char *in_R8;
  char *in_R9;
  short sVar21;
  Midi_Spec spec;
  ulong uVar22;
  uint channel;
  long lVar23;
  int in_stack_ffffffffffffed28;
  Screen screen;
  File_Selector fs;
  Channel_Monitor cm;
  long local_12a0;
  WINDOW_u w_1;
  string bankname_field;
  TUI_context ctx;
  string local_10b8;
  string local_1098;
  string local_1078;
  string local_1058;
  char pathbuf [4097];
  
  screen.active_ = false;
  initscr();
  screen.active_ = true;
  ctx.quit = false;
  memset(&ctx.win,0,0xf8);
  ctx.status_text._M_dataplus._M_p = (pointer)&ctx.status_text.field_2;
  ctx.status_text._M_string_length = 0;
  ctx.status_text.field_2._M_local_buf[0] = '\0';
  ctx.status_display = false;
  ctx.bank_directory._M_dataplus._M_p = (pointer)&ctx.bank_directory.field_2;
  ctx.status_timeout = 0;
  ctx.status_start.__d.__r._0_4_ = 0;
  ctx.status_start.__d.__r._4_4_ = 0;
  ctx.player._0_4_ = 0;
  ctx.player._4_4_ = 0;
  ctx.bank_directory._M_string_length = 0;
  ctx.bank_directory.field_2._M_local_buf[0] = '\0';
  ctx.perc_display_program.spec = GM;
  ctx.bank_mtime[0] = 0;
  ctx.bank_mtime[1]._0_5_ = 0;
  ctx.bank_mtime[1]._5_3_ = 0;
  ctx.perc_display_cycle = 0;
  ctx.have_perc_display_program = false;
  ctx.channel_state.size = 0;
  ctx.channel_state.serial = 0;
  ctx.perc_display_program.name = (char *)0x0;
  ctx.channel_state.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
  ctx.idle_proc = idle_proc;
  ctx.idle_data = idle_data;
  cVar7 = has_colors();
  if (cVar7 != '\0') {
    start_color();
    cVar7 = can_change_color();
    if (cVar7 != '\0') {
      init_color_rgb24(0,0x2e3436);
      init_color_rgb24(1,0xcc0000);
      init_color_rgb24(2,0x4e9a06);
      init_color_rgb24(3,0xc4a000);
      init_color_rgb24(4,0x3465a4);
      init_color_rgb24(5,0x75507b);
      init_color_rgb24(6,0x6989a);
      init_color_rgb24(7,0xd3d7cf);
      init_color_rgb24(8,0x555753);
      init_color_rgb24(9,0xef2929);
      init_color_rgb24(10,0x8ae234);
      init_color_rgb24(0xb,0xf57900);
      init_color_rgb24(0xc,0x729fcf);
      init_color_rgb24(0xd,0xad7fa8);
      init_color_rgb24(0xe,0x34e2e2);
      init_color_rgb24(0xf,0xeeeeec);
    }
    init_pair(1,7,0);
    init_pair(2,3,0);
    init_pair(3,0,7);
    init_pair(4,4,0);
    init_pair(5,2,0);
    init_pair(6,0,7);
    init_pair(7,4,0);
    init_pair(8,5,0);
    sVar21 = 9;
    for (lVar23 = 0; lVar23 != 0x40; lVar23 = lVar23 + 4) {
      init_color_rgb24(sVar21 + 7,*(uint32_t *)((long)&DAT_00184310 + lVar23));
      init_pair((int)sVar21,7,(int)(short)(sVar21 + 7));
      sVar21 = sVar21 + 1;
    }
  }
  raw();
  keypad(_stdscr,1);
  noecho();
  wtimeout(_stdscr,0x32);
  curs_set(0);
  set_escdelay(0x19);
  pcVar13 = getcwd(pathbuf,0x1001);
  if (pcVar13 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&ctx.bank_directory);
  }
  std::__cxx11::string::string((string *)pathbuf,"tui",(allocator *)&cm);
  IniProcessing::beginGroup(&configFile,(string *)pathbuf);
  std::__cxx11::string::~string((string *)pathbuf);
  IniProcessingVariant::IniProcessingVariant((IniProcessingVariant *)&cm,&ctx.bank_directory);
  IniProcessing::value
            ((IniProcessingVariant *)pathbuf,&configFile,"bank_directory",
             (IniProcessingVariant *)&cm);
  IniProcessingVariant::toString_abi_cxx11_(&bankname_field,(IniProcessingVariant *)pathbuf);
  std::__cxx11::string::operator=((string *)&ctx.bank_directory,(string *)&bankname_field);
  std::__cxx11::string::~string((string *)&bankname_field);
  std::__cxx11::string::~string((string *)pathbuf);
  std::__cxx11::string::~string((string *)&cm);
  IniProcessing::endGroup(&configFile);
  setup_display(&ctx);
  pcVar13 = (char *)gettext("Ready!");
  std::__cxx11::string::string((string *)&local_1098,pcVar13,(allocator *)pathbuf);
  show_status(&ctx,&local_1098,timeout);
  std::__cxx11::string::~string((string *)&local_1098);
  local_12a0 = std::chrono::_V2::steady_clock::now();
  do {
    if ((ctx.quit != false) || (bVar8 = interface_interrupted(), bVar8)) {
      memset((TUI_windows *)pathbuf,0,0xf8);
      TUI_windows::operator=(&ctx.win,(TUI_windows *)pathbuf);
      TUI_windows::~TUI_windows((TUI_windows *)pathbuf);
      if (screen.active_ == true) {
        endwin();
        screen.active_ = false;
      }
      bVar8 = interface_interrupted();
      if (bVar8) {
        fwrite("Interrupted.\n",0xd,1,_stderr);
      }
      TUI_context::~TUI_context(&ctx);
      Screen::~Screen(&screen);
      return;
    }
    if (idle_proc != (_func_void_void_ptr *)0x0) {
      (*idle_proc)(idle_data);
    }
    handle_notifications(&ctx);
    if (active_emulator_id == 0xffffffff) {
      pPVar14 = (Player *)0x0;
    }
    else {
      pPVar14 = active_player();
    }
    if ((Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_) != pPVar14) {
      ctx.player._0_4_ = SUB84(pPVar14,0);
      ctx.player._4_4_ = (undefined4)((ulong)pPVar14 >> 0x20);
      update_bank_mtime(&ctx);
    }
    lVar23 = std::chrono::_V2::steady_clock::now();
    if ((1000000000 < lVar23 - local_12a0) &&
       (bVar8 = update_bank_mtime(&ctx), local_12a0 = lVar23, bVar8)) {
      pPVar14 = (Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_);
      psVar15 = active_bank_file_abi_cxx11_();
      bVar8 = Player::dynamic_load_bank(pPVar14,(psVar15->_M_dataplus)._M_p);
      if (bVar8) {
        pcVar13 = (char *)gettext("Bank has changed on disk. Reload!");
        psVar15 = &local_1058;
        std::__cxx11::string::string((string *)psVar15,pcVar13,(allocator *)pathbuf);
        uVar11 = extraout_EDX;
      }
      else {
        pcVar13 = (char *)gettext("Bank has changed on disk. Reloading failed.");
        psVar15 = &local_1078;
        std::__cxx11::string::string((string *)psVar15,pcVar13,(allocator *)pathbuf);
        uVar11 = extraout_EDX_00;
      }
      show_status(&ctx,psVar15,uVar11);
      std::__cxx11::string::~string((string *)psVar15);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.outer._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    pPVar14 = (Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_);
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.outer._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      get_program_title_abi_cxx11_();
      uVar16 = pathbuf._8_8_;
      wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200400,0);
      in_R8 = (char *)0x2d;
      in_R9 = (char *)0x2d;
      wborder(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
              super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
              super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x20);
      wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200400,0);
      if (_stdscr == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = (ulong)(((int)*(short *)(_stdscr + 6) - (int)*(short *)(_stdscr + 10)) + 1);
      }
      uVar1 = uVar16 + 2;
      if (uVar1 <= uVar22) {
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200400,0);
        uVar22 = uVar22 - uVar1 >> 1;
        iVar9 = wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                      super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,uVar22 & 0xffffffff);
        if (iVar9 != -1) {
          waddch(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x28);
        }
        iVar9 = (int)uVar22;
        iVar10 = wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,
                       iVar9 + (int)uVar16 + 1);
        if (iVar10 != -1) {
          waddch(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x29);
        }
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200400,0);
        iVar9 = wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                      super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,iVar9 + 1);
        if (iVar9 != -1) {
          waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pathbuf._0_8_,0xffffffff);
        }
      }
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      std::__cxx11::string::~string((string *)pathbuf);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.playertitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.playertitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar9 = wmove(ctx.win.playertitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar9 != -1) {
        uVar16 = gettext("Player");
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar16,0xffffffff);
      }
      if (pPVar14 != (Player *)0x0) {
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        in_R8 = Player::name(pPVar14);
        in_R9 = Player::version(pPVar14);
        mvwprintw(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf,"%s %s");
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.emutitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.emutitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar9 = wmove(ctx.win.emutitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar9 != -1) {
        uVar16 = gettext("Emulator");
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar16,0xffffffff);
      }
      if (pPVar14 != (Player *)0x0) {
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        iVar9 = wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                      super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        if (iVar9 != -1) {
          iVar9 = (*pPVar14->_vptr_Player[6])(pPVar14);
          waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,iVar9,0xffffffff);
        }
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.chipcount._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.chipcount._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar9 = wmove(ctx.win.chipcount._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar9 != -1) {
        uVar16 = gettext("Chips");
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar16,0xffffffff);
      }
      if (pPVar14 != (Player *)0x0) {
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        uVar11 = (*pPVar14->_vptr_Player[10])(pPVar14);
        in_R8 = (char *)(ulong)uVar11;
        mvwprintw(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf,"%u");
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl," * ",0xffffffff);
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        pcVar13 = Player::chip_name(pPVar14);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pcVar13,0xffffffff);
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.cpuratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.cpuratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar9 = wmove(ctx.win.cpuratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar9 != -1) {
        uVar16 = gettext("CPU");
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar16,0xffffffff);
      }
      print_bar((WINDOW *)
                WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0xf,0xf,0x200,cpuratio,
                (char)in_R8,(char)in_R9,in_stack_ffffffffffffed28);
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.banktitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.banktitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar9 = wmove(ctx.win.banktitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar9 != -1) {
        uVar16 = gettext("Bank");
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar16,0xffffffff);
      }
      if (pPVar14 != (Player *)0x0) {
        pathbuf._0_8_ = pathbuf + 0x10;
        pathbuf[8] = '\0';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf[0x10] = '\0';
        psVar15 = active_bank_file_abi_cxx11_();
        if (psVar15->_M_string_length == 0) {
          gettext("(default)");
          std::__cxx11::string::assign(pathbuf);
        }
        else {
          lVar23 = std::__cxx11::string::rfind((char)psVar15,0x2f);
          if (lVar23 == -1) {
            std::__cxx11::string::string((string *)&cm,(string *)psVar15);
          }
          else {
            std::__cxx11::string::substr((ulong)&cm,(ulong)psVar15);
          }
          std::__cxx11::string::_M_assign((string *)pathbuf);
          std::__cxx11::string::~string((string *)&cm);
        }
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        iVar9 = wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                      super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        if (iVar9 != -1) {
          waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pathbuf._0_8_,0xffffffff);
        }
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        std::__cxx11::string::~string((string *)pathbuf);
      }
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.chanalloc._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.chanalloc._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar9 = wmove(ctx.win.chanalloc._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar9 != -1) {
        uVar16 = gettext("Alloc mode");
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar16,0xffffffff);
      }
      if (pPVar14 != (Player *)0x0) {
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        iVar9 = wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                      super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        if (iVar9 != -1) {
          pcVar13 = Player::get_channel_alloc_mode_name(pPVar14);
          waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pcVar13,0xffffffff);
        }
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    pathbuf[4] = lvcurrent[0]._4_1_;
    pathbuf[5] = lvcurrent[0]._5_1_;
    pathbuf[6] = lvcurrent[0]._6_1_;
    pathbuf[7] = lvcurrent[0]._7_1_;
    pathbuf[0] = lvcurrent[0]._0_1_;
    pathbuf[1] = lvcurrent[0]._1_1_;
    pathbuf[2] = lvcurrent[0]._2_1_;
    pathbuf[3] = lvcurrent[0]._3_1_;
    pathbuf[0xc] = lvcurrent[1]._4_1_;
    pathbuf[0xd] = lvcurrent[1]._5_1_;
    pathbuf[0xe] = lvcurrent[1]._6_1_;
    pathbuf[0xf] = lvcurrent[1]._7_1_;
    pathbuf[8] = lvcurrent[1]._0_1_;
    pathbuf[9] = lvcurrent[1]._1_1_;
    pathbuf[10] = lvcurrent[1]._2_1_;
    pathbuf[0xb] = lvcurrent[1]._3_1_;
    cm.P._M_t.
    super___uniq_ptr_impl<Channel_Monitor::Impl,_std::default_delete<Channel_Monitor::Impl>_>._M_t.
    super__Tuple_impl<0UL,_Channel_Monitor::Impl_*,_std::default_delete<Channel_Monitor::Impl>_>.
    super__Head_base<0UL,_Channel_Monitor::Impl_*,_false>._M_head_impl =
         (unique_ptr<Channel_Monitor::Impl,_std::default_delete<Channel_Monitor::Impl>_>)
         gettext("Left");
    gettext("Right");
    WVar4 = ctx.win.volumeratio;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.volumeratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar9 = wmove(ctx.win.volumeratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar9 != -1) {
        uVar16 = gettext("Volume");
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar16,0xffffffff);
      }
      wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      in_R8 = (char *)(ulong)(uint)player_volume;
      mvwprintw(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf,"%3d%%\n");
      wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    for (lVar23 = 0; lVar23 != 2; lVar23 = lVar23 + 1) {
      pWVar18 = ctx.win.volume[lVar23]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
      if (pWVar18 != (WINDOW *)0x0) {
        vol = *(double *)(pathbuf + lVar23 * 8);
        iVar9 = wmove(pWVar18,0,0);
        if (iVar9 != -1) {
          waddnstr(pWVar18,(&cm)[lVar23].P._M_t.
                           super___uniq_ptr_impl<Channel_Monitor::Impl,_std::default_delete<Channel_Monitor::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Channel_Monitor::Impl_*,_std::default_delete<Channel_Monitor::Impl>_>
                           .super__Head_base<0UL,_Channel_Monitor::Impl_*,_false>._M_head_impl,
                   0xffffffff);
        }
        print_bar(pWVar18,7,((int)pWVar18->_maxx - (int)pWVar18->_begx) + -6,0x200500,vol,
                  (char)in_R8,(char)in_R9,in_stack_ffffffffffffed28);
        wclrtoeol(pWVar18);
        wnoutrefresh(pWVar18);
      }
    }
    uVar22 = 0;
    while (WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
           super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>
           ._M_head_impl =
                ctx.win.status._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl, uVar22 != 0x10) {
      p_Var3 = ctx.win.instrument[uVar22]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
      if (p_Var3 == (_win_st *)0x0) {
        uVar22 = uVar22 + 1;
      }
      else {
        in_R8 = (char *)(uVar22 + 1 & 0xffffffff);
        mvwprintw(p_Var3,0,0,"%2u: [");
        wattr_on(p_Var3,0x200800,0);
        pPVar20 = channel_map + uVar22;
        wprintw(p_Var3,"%3u",pPVar20->gm);
        wattr_off(p_Var3,0x200800,0);
        waddnstr(p_Var3,"]",0xffffffff);
        uVar11 = midi_channel_note_count[uVar22];
        wattr_on(p_Var3,&fde_00200500,0);
        iVar9 = wmove(p_Var3,0,0xb);
        if (iVar9 != -1) {
          uVar16 = 0x2a;
          if (uVar11 == 0) {
            uVar16 = 0x20;
          }
          waddch(p_Var3,uVar16);
        }
        wattr_off(p_Var3,&fde_00200500,0);
        if (uVar22 == 9) {
          ctx.perc_display_cycle = ctx.perc_display_cycle + 1;
          if ((ctx.perc_display_cycle == 10) &&
             (ctx.perc_display_cycle = 0, midi_channel_last_note_p1[9] != 0)) {
            uVar11 = midi_channel_last_note_p1[9] - 1;
            ctx.have_perc_display_program = true;
            ctx.perc_display_program.spec = midi_db.midi_perc_[uVar11].spec;
            ctx.perc_display_program._4_4_ = *(undefined4 *)&midi_db.midi_perc_[uVar11].field_0x4;
            ctx.perc_display_program.name = midi_db.midi_perc_[uVar11].name;
          }
          pcVar13 = ctx.perc_display_program.name;
          spec = ctx.perc_display_program.spec;
          if (ctx.have_perc_display_program == false) {
            pcVar13 = (char *)gettext("Percussion");
            spec = GM;
          }
        }
        else {
          spec = GM;
          if ((channel_map[uVar22].bank_lsb != 0 || channel_map[uVar22].bank_msb != 0) &&
             (pMVar17 = Midi_Db::find_ex(&midi_db,channel_map[uVar22].bank_msb,
                                         channel_map[uVar22].bank_lsb,pPVar20->gm),
             pMVar17 != (Midi_Program_Ex *)0x0)) {
            spec = pMVar17->spec;
            pcVar13 = pMVar17->name;
            if (pMVar17->name != (char *)0x0) goto LAB_00113fbe;
          }
          pcVar13 = midi_db.midi_inst_[pPVar20->gm];
        }
LAB_00113fbe:
        uVar2 = (&DAT_00184350)[spec];
        wattr_on(p_Var3,uVar2,0);
        iVar9 = wmove(p_Var3,0,0xc);
        if (iVar9 != -1) {
          waddnstr(p_Var3,pcVar13,0xffffffff);
        }
        wattr_off(p_Var3,uVar2,0);
        if (spec != GM) {
          pcVar13 = midi_spec_name(spec);
          wprintw(p_Var3," [%s]",pcVar13);
        }
        wclrtoeol(p_Var3);
        wrefresh(p_Var3);
        uVar22 = uVar22 + 1;
      }
    }
    if (((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
         ctx.win.status._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
         super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
         _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) &&
       (ctx.status_text._M_string_length != 0)) {
      if (ctx.status_display == false) {
        wattr_on(ctx.win.status._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x300,0);
        iVar9 = wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                      super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
        if (iVar9 != -1) {
          waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                   ctx.status_text._M_dataplus._M_p,0xffffffff);
        }
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x300,0);
        uVar16 = std::chrono::_V2::steady_clock::now();
        ctx.status_start.__d.__r._0_4_ = (undefined4)uVar16;
        ctx.status_start.__d.__r._4_4_ = (undefined4)((ulong)uVar16 >> 0x20);
        ctx.status_display = true;
        wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      }
      else {
        lVar23 = std::chrono::_V2::steady_clock::now();
        if (lVar23 - CONCAT44(ctx.status_start.__d.__r._4_4_,(undefined4)ctx.status_start.__d.__r)
            <= (long)((ulong)ctx.status_timeout * 1000000000)) goto LAB_00114115;
        ctx.status_text._M_string_length = 0;
        *ctx.status_text._M_dataplus._M_p = '\0';
        ctx.status_display = false;
        werase(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      }
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
LAB_00114115:
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.keydesc1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.keydesc1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      if ((update_display(TUI_context&)::keydesc == '\0') &&
         (iVar9 = __cxa_guard_acquire(&update_display(TUI_context&)::keydesc), iVar9 != 0)) {
        DAT_002162e8 = gettext("prev emulator");
        update_display(TUI_context&)::keydesc = "<";
        _DAT_002162f8 = gettext("next emulator");
        _DAT_002162f0 = ">";
        _DAT_00216308 = gettext("chips -1");
        _DAT_00216300 = "[";
        _DAT_00216318 = gettext("chips +1");
        _DAT_00216310 = "]";
        _DAT_00216328 = gettext("load bank");
        _DAT_00216320 = "b";
        __cxa_guard_release(&update_display(TUI_context&)::keydesc);
      }
      for (uVar22 = 0; uVar22 != 0x50; uVar22 = uVar22 + 0x10) {
        wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
              super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
              super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,uVar22 & 0xffffffff);
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar22),0xffffffff);
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl," ",0xffffffff);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&DAT_002162e8 + uVar22),0xffffffff);
      }
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.keydesc2._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.keydesc2._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      if ((update_display(TUI_context&)::keydesc == '\0') &&
         (iVar9 = __cxa_guard_acquire(&update_display(TUI_context&)::keydesc), iVar9 != 0)) {
        DAT_00216348 = gettext("volume -1");
        update_display(TUI_context&)::keydesc = "/";
        _DAT_00216358 = gettext("volume +1");
        _DAT_00216350 = "*";
        _DAT_00216368 = gettext("panic");
        _DAT_00216360 = "p";
        _DAT_00216378 = gettext("channels");
        _DAT_00216370 = "c";
        _DAT_00216388 = gettext("quit");
        _DAT_00216380 = "q";
        __cxa_guard_release(&update_display(TUI_context&)::keydesc);
      }
      for (uVar22 = 0; uVar22 != 0x50; uVar22 = uVar22 + 0x10) {
        wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
              super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
              super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,uVar22 & 0xffffffff);
        wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar22),0xffffffff);
        wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl," ",0xffffffff);
        waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&DAT_00216348 + uVar22),0xffffffff);
      }
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.keydesc3._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.keydesc3._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      if ((update_display(TUI_context&)::keydesc == '\0') &&
         (iVar9 = __cxa_guard_acquire(&update_display(TUI_context&)::keydesc), iVar9 != 0)) {
        DAT_002163a8 = gettext("next chanalloc");
        update_display(TUI_context&)::keydesc = "a";
        __cxa_guard_release(&update_display(TUI_context&)::keydesc);
      }
      wmove(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
            super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
            super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      wattr_on(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
      waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
               update_display(TUI_context&)::keydesc,0xffffffff);
      wattr_off(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
      waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl," ",0xffffffff);
      waddnstr(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,DAT_002163a8,0xffffffff);
      wclrtoeol(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar4._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    iVar9 = wgetch(_stdscr);
    bVar8 = handle_anylevel_key(&ctx,iVar9);
    if ((!bVar8) &&
       (pPVar14 = (Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_), pPVar14 != (Player *)0x0))
    {
      switch(iVar9) {
      case 0x3c:
        if (active_emulator_id != 0) {
          dynamic_switch_emulator_id(active_emulator_id - 1);
          std::__cxx11::string::string((string *)pathbuf,"synth",(allocator *)&cm);
          IniProcessing::beginGroup(&configFile,(string *)pathbuf);
          std::__cxx11::string::~string((string *)pathbuf);
          IniProcessing::setValue(&configFile,"emulator",pPVar14->emulator_);
LAB_0011492e:
          if (active_emulator_id == 0xffffffff) {
            value = OPL3;
          }
          else {
            value = emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                    _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
          }
          pcVar13 = "pt";
LAB_00114a6f:
          IniProcessing::setValue(&configFile,pcVar13,value);
          goto LAB_00114a7d;
        }
        break;
      case 0x3d:
      case 0x3f:
      case 0x40:
        break;
      case 0x3e:
        if ((ulong)(active_emulator_id + 1) <
            (ulong)(((long)emulator_ids.
                           super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
          dynamic_switch_emulator_id(active_emulator_id + 1);
          std::__cxx11::string::string((string *)pathbuf,"synth",(allocator *)&cm);
          IniProcessing::beginGroup(&configFile,(string *)pathbuf);
          std::__cxx11::string::~string((string *)pathbuf);
          IniProcessing::setValue(&configFile,"emulator",pPVar14->emulator_);
          goto LAB_0011492e;
        }
        break;
      case 0x41:
switchD_00114345_caseD_61:
        iVar10 = (*pPVar14->_vptr_Player[0xf])(pPVar14);
        iVar9 = iVar10 + 1;
        if (1 < iVar10) {
          iVar9 = -1;
        }
        Player::dynamic_set_channel_alloc(pPVar14,iVar9);
        std::__cxx11::string::string((string *)pathbuf,"synth",(allocator *)&cm);
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        std::__cxx11::string::~string((string *)pathbuf);
        pcVar13 = "chanalloc";
LAB_00114a55:
        IniProcessing::setValue(&configFile,pcVar13,iVar9);
LAB_00114a7d:
        IniProcessing::endGroup(&configFile);
        IniProcessing::writeIniFile(&configFile);
        break;
      case 0x42:
switchD_00114345_caseD_62:
        erase();
        pathbuf._0_8_ = pathbuf + 0x10;
        pathbuf[8] = '\0';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf[0x10] = '\0';
        pathbuf._32_8_ = pathbuf + 0x30;
        pathbuf[0x28] = '\0';
        pathbuf[0x29] = '\0';
        pathbuf[0x2a] = '\0';
        pathbuf[0x2b] = '\0';
        pathbuf[0x2c] = '\0';
        pathbuf[0x2d] = '\0';
        pathbuf[0x2e] = '\0';
        pathbuf[0x2f] = '\0';
        pathbuf[0x30] = '\0';
        pathbuf._64_8_ = pathbuf + 0x50;
        pathbuf[0x48] = '\0';
        pathbuf[0x49] = '\0';
        pathbuf[0x4a] = '\0';
        pathbuf[0x4b] = '\0';
        pathbuf[0x4c] = '\0';
        pathbuf[0x4d] = '\0';
        pathbuf[0x4e] = '\0';
        pathbuf[0x4f] = '\0';
        pathbuf[0x50] = '\0';
        pathbuf[0x60] = '\0';
        gettext("Load bank");
        std::__cxx11::string::assign(pathbuf + 0x40);
        std::__cxx11::string::_M_assign((string *)pathbuf);
        File_Selector::File_Selector(&fs,(File_Selection_Options *)pathbuf);
        in_R8 = (char *)0x0;
        w_1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                       derwin(_stdscr,_LINES,_COLS,0);
        File_Selector::setup_display
                  (&fs,(WINDOW *)
                       w_1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
        File_Selector::update(&fs);
        pvVar6 = ctx.idle_data;
        p_Var5 = ctx.idle_proc;
        iVar9 = wgetch(_stdscr);
        FVar12 = Continue;
        while ((ctx.quit == false && (bVar8 = interface_interrupted(), FVar12 == Continue && !bVar8)
               )) {
          if (p_Var5 != (_func_void_void_ptr *)0x0) {
            (*p_Var5)(pvVar6);
          }
          handle_notifications(&ctx);
          bVar8 = handle_anylevel_key(&ctx,iVar9);
          if (bVar8) {
            FVar12 = Continue;
            if (iVar9 == 0x19a) {
              in_R8 = (char *)0x0;
              p_Var19 = (pointer)derwin(_stdscr,_LINES,_COLS,0);
              std::__uniq_ptr_impl<_win_st,_WINDOW_deleter>::reset
                        ((__uniq_ptr_impl<_win_st,_WINDOW_deleter> *)&w_1,p_Var19);
              File_Selector::setup_display
                        (&fs,(WINDOW *)
                             w_1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                             super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                             super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
              FVar12 = Continue;
            }
          }
          else {
            FVar12 = File_Selector::key(&fs,iVar9);
            File_Selector::update(&fs);
          }
          doupdate();
          iVar9 = wgetch(_stdscr);
        }
        if (FVar12 == Ok) {
          bVar8 = Player::dynamic_load_bank(pPVar14,(char *)pathbuf._32_8_);
          if (bVar8) {
            pcVar13 = (char *)gettext("Bank loaded!");
            std::__cxx11::string::string((string *)&cm,pcVar13,(allocator *)&bankname_field);
            show_status(&ctx,(string *)&cm,timeout_00);
            std::__cxx11::string::~string((string *)&cm);
            psVar15 = active_bank_file_abi_cxx11_();
            std::__cxx11::string::_M_assign((string *)psVar15);
            update_bank_mtime(&ctx);
          }
          else {
            pcVar13 = (char *)gettext("Error loading the bank file.");
            std::__cxx11::string::string((string *)&cm,pcVar13,(allocator *)&bankname_field);
            show_status(&ctx,(string *)&cm,timeout_01);
            std::__cxx11::string::~string((string *)&cm);
          }
          std::__cxx11::string::_M_assign((string *)&ctx.bank_directory);
        }
        std::__cxx11::string::string((string *)&bankname_field,"tui",(allocator *)&local_10b8);
        IniProcessing::beginGroup(&configFile,&bankname_field);
        std::__cxx11::string::~string((string *)&bankname_field);
        IniProcessing::setValue(&configFile,"bank_directory",&ctx.bank_directory);
        psVar15 = player_bank_file_abi_cxx11_;
        for (lVar23 = 0; lVar23 != 2; lVar23 = lVar23 + 1) {
          std::__cxx11::to_string(&local_10b8,(uint)lVar23);
          std::operator+(&bankname_field,"bankfile-",&local_10b8);
          std::__cxx11::string::~string((string *)&local_10b8);
          IniProcessing::setValue(&configFile,bankname_field._M_dataplus._M_p,psVar15);
          std::__cxx11::string::~string((string *)&bankname_field);
          psVar15 = psVar15 + 1;
        }
        IniProcessing::endGroup(&configFile);
        IniProcessing::writeIniFile(&configFile);
        erase();
        std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr(&w_1);
        File_Selector::~File_Selector(&fs);
        File_Selection_Options::~File_Selection_Options((File_Selection_Options *)pathbuf);
        break;
      case 0x43:
switchD_00114345_caseD_63:
        erase();
        in_R8 = (char *)0x0;
        pWVar18 = (WINDOW *)derwin(_stdscr,_LINES,_COLS,0);
        pathbuf._0_8_ = pWVar18;
        Channel_Monitor::Channel_Monitor(&cm);
        Channel_Monitor::setup_display(&cm,pWVar18);
        Channel_Monitor::setup_player(&cm,pPVar14);
        Channel_Monitor::update
                  (&cm,(char *)ctx.channel_state.data._M_t.
                               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl,
                   ctx.channel_state.size,ctx.channel_state.serial);
        pvVar6 = ctx.idle_data;
        p_Var5 = ctx.idle_proc;
        iVar10 = wgetch(_stdscr);
        iVar9 = 1;
        while ((ctx.quit == false && (bVar8 = interface_interrupted(), !bVar8 && 0 < iVar9))) {
          if (p_Var5 != (_func_void_void_ptr *)0x0) {
            (*p_Var5)(pvVar6);
          }
          handle_notifications(&ctx);
          bVar8 = handle_anylevel_key(&ctx,iVar10);
          if (bVar8) {
            if (iVar10 == 0x19a) {
              in_R8 = (char *)0x0;
              p_Var19 = (pointer)derwin(_stdscr,_LINES,_COLS,0);
              std::__uniq_ptr_impl<_win_st,_WINDOW_deleter>::reset
                        ((__uniq_ptr_impl<_win_st,_WINDOW_deleter> *)pathbuf,p_Var19);
              Channel_Monitor::setup_display(&cm,(WINDOW *)pathbuf._0_8_);
            }
          }
          else {
            iVar9 = Channel_Monitor::key(&cm,iVar10);
            Channel_Monitor::update
                      (&cm,(char *)ctx.channel_state.data._M_t.
                                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl,
                       ctx.channel_state.size,ctx.channel_state.serial);
          }
          doupdate();
          iVar10 = wgetch(_stdscr);
        }
        erase();
        Channel_Monitor::~Channel_Monitor(&cm);
        std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr
                  ((unique_ptr<_win_st,_WINDOW_deleter> *)pathbuf);
        break;
      default:
        switch(iVar9) {
        case 0x5b:
          uVar11 = (*pPVar14->_vptr_Player[10])(pPVar14);
          if (1 < uVar11) {
            Player::dynamic_set_chip_count(pPVar14,uVar11 - 1);
            std::__cxx11::string::string((string *)pathbuf,"synth",(allocator *)&cm);
            IniProcessing::beginGroup(&configFile,(string *)pathbuf);
            goto LAB_00114999;
          }
          break;
        case 0x5c:
        case 0x5e:
        case 0x5f:
        case 0x60:
          break;
        case 0x5d:
          iVar9 = (*pPVar14->_vptr_Player[10])(pPVar14);
          Player::dynamic_set_chip_count(pPVar14,iVar9 + 1);
          std::__cxx11::string::string((string *)pathbuf,"synth",(allocator *)&cm);
          IniProcessing::beginGroup(&configFile,(string *)pathbuf);
LAB_00114999:
          std::__cxx11::string::~string((string *)pathbuf);
          value = (*pPVar14->_vptr_Player[10])(pPVar14);
          pcVar13 = "nchip";
          goto LAB_00114a6f;
        case 0x61:
          goto switchD_00114345_caseD_61;
        case 0x62:
          goto switchD_00114345_caseD_62;
        case 99:
          goto switchD_00114345_caseD_63;
        default:
          if (iVar9 == 0x2a) {
            if (0x1f2 < player_volume) {
              player_volume = 499;
            }
            player_volume = player_volume + 1;
            std::__cxx11::string::string((string *)pathbuf,"synth",(allocator *)&cm);
            IniProcessing::beginGroup(&configFile,(string *)pathbuf);
          }
          else {
            if (iVar9 != 0x2f) {
              if ((iVar9 == 0x50) || (iVar9 == 0x70)) {
                Player::dynamic_panic(pPVar14);
              }
              break;
            }
            if (player_volume < 2) {
              player_volume = 1;
            }
            player_volume = player_volume + -1;
            std::__cxx11::string::string((string *)pathbuf,"synth",(allocator *)&cm);
            IniProcessing::beginGroup(&configFile,(string *)pathbuf);
          }
          std::__cxx11::string::~string((string *)pathbuf);
          pcVar13 = "volume";
          iVar9 = player_volume;
          goto LAB_00114a55;
        }
      }
    }
    doupdate();
  } while( true );
}

Assistant:

void curses_interface_exec(void (*idle_proc)(void *), void *idle_data)
{
    Screen screen;
    screen.init();

    TUI_context ctx;
    ctx.idle_proc = idle_proc;
    ctx.idle_data = idle_data;
#if defined(PDCURSES)
    install_event_hook(ctx);
#endif

    if (has_colors())
        setup_colors();
    raw();
    keypad(stdscr, true);
    noecho();
#ifdef ADLJACK_GTK3
    const unsigned timeout_ms = 1;
#else
    const unsigned timeout_ms = 50;
#endif
    timeout(timeout_ms);
    curs_set(0);
#if !defined(PDCURSES)
    set_escdelay(25);
#endif

#if defined(PDCURSES)
    PDC_set_title(get_program_title().c_str());
#endif

    {
        char pathbuf[PATH_MAX + 1];
        if (char *path = getcwd(pathbuf, sizeof(pathbuf)))
            ctx.bank_directory.assign(path);
    }

    configFile.beginGroup("tui");
    ctx.bank_directory = configFile.value("bank_directory", ctx.bank_directory).toString();
    configFile.endGroup();

#ifdef ADLJACK_GTK3
    s_tray_icon = create_tray_icon();

    if (active_player().type() == Player_Type::OPL3) {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "adljack");
    } else {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "opnjack");
    }

    g_signal_connect(G_OBJECT(s_tray_icon), "popup-menu", G_CALLBACK(tray_icon_on_menu),  &ctx);
#endif

    setup_display(ctx);
    show_status(ctx, _("Ready!"));

    unsigned bank_check_interval = 1;
    stc::steady_clock::time_point bank_check_last = stc::steady_clock::now();

    while (!ctx.quit && !interface_interrupted()) {
        if (idle_proc)
            idle_proc(idle_data);

        handle_notifications(ctx);

        Player *player = have_active_player() ? &active_player() : nullptr;
        if (ctx.player != player) {
            ctx.player = player;
            update_bank_mtime(ctx);
        }

        stc::steady_clock::time_point now = stc::steady_clock::now();
        if (now - bank_check_last > stc::seconds(bank_check_interval)) {
            if (update_bank_mtime(ctx)) {
                if (ctx.player->dynamic_load_bank(active_bank_file().c_str()))
                    show_status(ctx, _("Bank has changed on disk. Reload!"));
                else
                    show_status(ctx, _("Bank has changed on disk. Reloading failed."));
            }
            bank_check_last = now;
        }

        update_display(ctx);

#ifdef ADLJACK_GTK3
        gtk_main_iteration_do(false);
#endif
        int key = getch();
        if (!handle_anylevel_key(ctx, key))
            handle_toplevel_key(ctx, key);
        doupdate();
    }
    ctx.win = TUI_windows();
    screen.end();

#ifdef ADLJACK_GTK3
    gtk_status_icon_set_visible(s_tray_icon, FALSE);
#endif

    if (interface_interrupted())
        fprintf(stderr, "Interrupted.\n");
}